

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

mbedtls_x509_crt *
x509_crt_find_parent_in
          (mbedtls_x509_crt *child,mbedtls_x509_crt *candidates,int top,size_t path_cnt,
          size_t self_cnt)

{
  int iVar1;
  mbedtls_x509_crt *pmVar2;
  
  pmVar2 = (mbedtls_x509_crt *)0x0;
  do {
    if (candidates == (mbedtls_x509_crt *)0x0) {
      return pmVar2;
    }
    iVar1 = x509_name_cmp(&child->issuer,&candidates->subject);
    if (((iVar1 == 0) &&
        ((((top != 0 && (candidates->version < 3)) ||
          ((candidates->ca_istrue != 0 &&
           (iVar1 = mbedtls_x509_crt_check_key_usage(candidates,4), iVar1 == 0)))) &&
         (((long)candidates->max_pathlen < 1 ||
          ((path_cnt - self_cnt) + 1 <= (ulong)(long)candidates->max_pathlen)))))) &&
       ((top == 0 || (iVar1 = x509_crt_check_signature(child,candidates), iVar1 == 0)))) {
      iVar1 = mbedtls_x509_time_is_past(&candidates->valid_to);
      if ((iVar1 == 0) && (iVar1 = mbedtls_x509_time_is_future(&candidates->valid_from), iVar1 == 0)
         ) {
        return candidates;
      }
      if (pmVar2 == (mbedtls_x509_crt *)0x0) {
        pmVar2 = candidates;
      }
    }
    candidates = candidates->next;
  } while( true );
}

Assistant:

static mbedtls_x509_crt *x509_crt_find_parent_in( mbedtls_x509_crt *child,
                                                  mbedtls_x509_crt *candidates,
                                                  int top,
                                                  size_t path_cnt,
                                                  size_t self_cnt )
{
    mbedtls_x509_crt *parent, *badtime_parent = NULL;

    for( parent = candidates; parent != NULL; parent = parent->next )
    {
        /* basic parenting skills (name, CA bit, key usage) */
        if( x509_crt_check_parent( child, parent, top ) != 0 )
            continue;

        /* +1 because stored max_pathlen is 1 higher that the actual value */
        if( parent->max_pathlen > 0 &&
            (size_t) parent->max_pathlen < 1 + path_cnt - self_cnt )
        {
            continue;
        }

        /* Signature */
        if( top && x509_crt_check_signature( child, parent ) != 0 )
        {
            continue;
        }

        /* optional time check */
        if( mbedtls_x509_time_is_past( &parent->valid_to ) ||
            mbedtls_x509_time_is_future( &parent->valid_from ) )
        {
            if( badtime_parent == NULL )
                badtime_parent = parent;

            continue;
        }

        break;
    }

    if( parent == NULL )
        parent = badtime_parent;

    return( parent );
}